

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O2

GridNode * __thiscall Grid::get_target_node(Grid *this)

{
  GridNode *pGVar1;
  uint uVar2;
  GridNode *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  GridNode *pGVar7;
  long lVar8;
  GridNode *pGVar9;
  
  uVar2 = this->columns;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  uVar6 = (ulong)(uint)this->rows;
  if (this->rows < 1) {
    uVar6 = uVar4;
  }
  pGVar7 = this->nodes + -1;
  do {
    lVar8 = uVar5 + 1;
    pGVar9 = pGVar7;
    if (uVar4 == uVar6) {
      return this->nodes;
    }
    while (lVar8 + -1 != 0) {
      pGVar1 = pGVar9 + 1;
      pGVar3 = pGVar9 + 1;
      lVar8 = lVar8 + -1;
      pGVar9 = pGVar1;
      if (pGVar3->state == TARGET) {
        return pGVar1;
      }
    }
    uVar4 = uVar4 + 1;
    pGVar7 = pGVar7 + (int)uVar2;
  } while( true );
}

Assistant:

GridNode *get_target_node()
    {
        for (int y = 0; y < rows; y++)
        {
            for (int x = 0; x < columns; x++)
            {
                if (get_node_from_position(x, y)->state == TARGET)
                {
                    return get_node_from_position(x, y);
                }
            }
        }
        return get_node_from_position(0, 0);
    }